

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O1

bool sb_reserve_next_reusable_blocks(fdb_kvs_handle *handle)

{
  superblock *psVar1;
  bid_t count;
  ulong uVar2;
  sb_rsv_bmp *psVar3;
  uint8_t *puVar4;
  ulong uVar5;
  reusable_block *prVar6;
  size_t sVar7;
  stale_header_info stale_header;
  reusable_block_list rVar8;
  
  psVar1 = handle->file->sb;
  if ((psVar1->rsv_bmp == (sb_rsv_bmp *)0x0) &&
     (stale_header = fdb_get_smallest_active_header(handle), stale_header.bid != 0xffffffffffffffff)
     ) {
    rVar8 = fdb_get_reusable_block(handle,stale_header);
    if (rVar8.n_blocks != 0) {
      uVar2 = (handle->file->pos).super___atomic_base<unsigned_long>._M_i;
      uVar5 = (ulong)handle->file->blocksize;
      if (uVar2 < uVar5) {
        return true;
      }
      sVar7 = 0;
      uVar2 = uVar2 / uVar5;
      psVar3 = (sb_rsv_bmp *)calloc(1,0x68);
      puVar4 = (uint8_t *)calloc(1,uVar2 + 7 >> 3);
      psVar3->bmp = puVar4;
      psVar3->cur_alloc_bid = 0xffffffffffffffff;
      LOCK();
      (psVar3->status).super___atomic_base<unsigned_int>._M_i = 1;
      UNLOCK();
      avl_init(&psVar3->bmp_idx,(void *)0x0);
      psVar3->bmp_size = uVar2;
      prVar6 = rVar8.blocks;
      do {
        sb_bmp_set(psVar3->bmp,prVar6->bid,prVar6->count);
        if ((sVar7 == 0) && (psVar3->cur_alloc_bid == 0xffffffffffffffff)) {
          psVar3->cur_alloc_bid = prVar6->bid;
        }
        count = prVar6->count;
        psVar3->num_free_blocks = psVar3->num_free_blocks + count;
        _add_bmp_idx(&psVar3->bmp_idx,prVar6->bid,count);
        sVar7 = sVar7 + 1;
        prVar6 = prVar6 + 1;
      } while (rVar8.n_blocks != sVar7);
      free(rVar8.blocks);
      psVar3->min_live_hdr_revnum = stale_header.revnum;
      psVar3->min_live_hdr_bid = stale_header.bid;
      psVar3->bmp_revnum = (psVar1->bmp_revnum).super___atomic_base<unsigned_long>._M_i + 1;
      psVar1->rsv_bmp = psVar3;
      return true;
    }
  }
  return false;
}

Assistant:

bool sb_reserve_next_reusable_blocks(fdb_kvs_handle *handle)
{
    size_t i;
    uint64_t num_blocks, bmp_size_byte;
    stale_header_info sheader;
    reusable_block_list blist;
    struct superblock *sb = handle->file->sb;
    struct sb_rsv_bmp *rsv = NULL;

    if (sb->rsv_bmp) {
        // next bitmap already reclaimed
        return false;
    }

    sheader = fdb_get_smallest_active_header(handle);
    if (sheader.bid == BLK_NOT_FOUND) {
        return false;
    }

    // get reusable block list
    blist = fdb_get_reusable_block(handle, sheader);
    if (blist.n_blocks == 0) {
        return false;
    }

    // calculate bitmap size
    num_blocks = filemgr_get_pos(handle->file) / handle->file->blocksize;
    bmp_size_byte = (num_blocks+7) / 8;
    if (num_blocks) {
        rsv = (struct sb_rsv_bmp*)calloc(1, sizeof(struct sb_rsv_bmp));
        rsv->bmp = (uint8_t*)calloc(1, bmp_size_byte);
        rsv->cur_alloc_bid = BLK_NOT_FOUND;

        // the initial status is 'INITIALIZING' so that 'rsv_bmp' is not
        // available until executing sb_rsv_append_doc().
        atomic_init_uint32_t(&rsv->status, SB_RSV_INITIALIZING);
        avl_init(&rsv->bmp_idx, NULL);
        rsv->bmp_size = num_blocks;

        for (i=0; i<blist.n_blocks; ++i) {
            sb_bmp_set(rsv->bmp, blist.blocks[i].bid, blist.blocks[i].count);
            if (i==0 && rsv->cur_alloc_bid == BLK_NOT_FOUND) {
                rsv->cur_alloc_bid = blist.blocks[i].bid;
            }
            rsv->num_free_blocks += blist.blocks[i].count;
            _add_bmp_idx(&rsv->bmp_idx, blist.blocks[i].bid, blist.blocks[i].count);
        }
        free(blist.blocks);

        rsv->min_live_hdr_revnum = sheader.revnum;
        rsv->min_live_hdr_bid = sheader.bid;
        rsv->bmp_revnum = atomic_get_uint64_t(&sb->bmp_revnum)+1;
        sb->rsv_bmp = rsv;
    }

    return true;
}